

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlBufAttrSerializeTxtContent(xmlBufPtr buf,xmlDocPtr doc,xmlAttrPtr attr,xmlChar *string)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  byte *pbVar6;
  uint val;
  long lVar7;
  int iVar8;
  uchar tmp [12];
  uchar local_3c [12];
  
  if (string != (xmlChar *)0x0) {
    pbVar6 = string;
LAB_001afdbd:
    while( true ) {
      bVar1 = *pbVar6;
      iVar5 = (int)pbVar6;
      iVar8 = (int)string;
      if (bVar1 < 0x22) break;
      if (bVar1 < 0x3c) {
        if (bVar1 != 0x22) {
          if (bVar1 == 0x26) {
            pcVar4 = "&amp;";
            if (string != pbVar6) {
              xmlBufAdd(buf,string,iVar5 - iVar8);
            }
            goto LAB_001afeaf;
          }
          goto LAB_001aff14;
        }
        if (string != pbVar6) {
          xmlBufAdd(buf,string,iVar5 - iVar8);
        }
        pcVar4 = "&quot;";
        iVar5 = 6;
      }
      else {
        if (bVar1 == 0x3c) {
          pcVar4 = "&lt;";
          if (string != pbVar6) {
            xmlBufAdd(buf,string,iVar5 - iVar8);
          }
        }
        else {
          if (bVar1 != 0x3e) goto LAB_001aff14;
          pcVar4 = "&gt;";
          if (string != pbVar6) {
            xmlBufAdd(buf,string,iVar5 - iVar8);
          }
        }
LAB_001afef7:
        iVar5 = 4;
      }
LAB_001afefc:
      xmlBufAdd(buf,(xmlChar *)pcVar4,iVar5);
      string = pbVar6 + 1;
      pbVar6 = string;
    }
    if (9 < bVar1) {
      if (bVar1 == 10) {
        if (string != pbVar6) {
          xmlBufAdd(buf,string,iVar5 - iVar8);
        }
        pcVar4 = "&#10;";
      }
      else {
        if (bVar1 != 0xd) goto LAB_001aff14;
        if (string != pbVar6) {
          xmlBufAdd(buf,string,iVar5 - iVar8);
        }
        pcVar4 = "&#13;";
      }
LAB_001afeaf:
      iVar5 = 5;
      goto LAB_001afefc;
    }
    if (bVar1 == 9) {
      if (string != pbVar6) {
        xmlBufAdd(buf,string,iVar5 - iVar8);
      }
      pcVar4 = "&#9;";
      goto LAB_001afef7;
    }
    if (bVar1 != 0) {
LAB_001aff14:
      if ((((char)bVar1 < '\0') && (pbVar6[1] != 0)) &&
         ((doc == (xmlDocPtr)0x0 || (doc->encoding == (xmlChar *)0x0)))) {
        if (string != pbVar6) {
          xmlBufAdd(buf,string,iVar5 - iVar8);
        }
        string = pbVar6 + 1;
        bVar1 = *pbVar6;
        if (bVar1 < 0xc0) {
          iVar5 = 0x578;
          pcVar4 = "string is not in UTF-8\n";
        }
        else {
          uVar3 = (uint)bVar1;
          if (bVar1 < 0xe0) {
            val = *string & 0x3f | (uVar3 & 0x1f) << 6;
            lVar7 = 2;
LAB_001affa6:
            bVar2 = false;
          }
          else {
            if ((bVar1 < 0xf0) && (pbVar6[2] != 0)) {
              val = pbVar6[2] & 0x3f | (*string & 0x3f | (uVar3 & 0xf) << 6) << 6;
              lVar7 = 3;
              goto LAB_001affa6;
            }
            lVar7 = 1;
            bVar2 = true;
            val = 0;
            if (((bVar1 < 0xf8) && (pbVar6[2] != 0)) && (pbVar6[3] != 0)) {
              val = pbVar6[3] & 0x3f |
                    (pbVar6[2] & 0x3f | (*string & 0x3f) << 6 | (uVar3 & 7) << 0xc) << 6;
              lVar7 = 4;
              bVar2 = false;
            }
          }
          if (!bVar2) {
            if (val < 0x100) {
              if ((val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0))))
              goto LAB_001b00a1;
            }
            else if ((0xfffff < val - 0x10000 && 0x1ffd < val - 0xe000) && 0xd7ff < val)
            goto LAB_001b00a1;
            xmlSerializeHexCharRef(local_3c,val);
            xmlBufAdd(buf,local_3c,-1);
            string = pbVar6 + lVar7;
            pbVar6 = string;
            goto LAB_001afdbd;
          }
LAB_001b00a1:
          iVar5 = 0x579;
          pcVar4 = "invalid character value\n";
        }
        __xmlSimpleError(7,iVar5,(xmlNodePtr)attr,pcVar4,(char *)0x0);
        xmlSerializeHexCharRef(local_3c,(uint)*pbVar6);
        xmlBufAdd(buf,local_3c,-1);
        pbVar6 = string;
      }
      else {
        pbVar6 = pbVar6 + 1;
      }
      goto LAB_001afdbd;
    }
    if (string != pbVar6) {
      xmlBufAdd(buf,string,iVar5 - iVar8);
    }
  }
  return;
}

Assistant:

void
xmlBufAttrSerializeTxtContent(xmlBufPtr buf, xmlDocPtr doc,
                              xmlAttrPtr attr, const xmlChar * string)
{
    xmlChar *base, *cur;

    if (string == NULL)
        return;
    base = cur = (xmlChar *) string;
    while (*cur != 0) {
        if (*cur == '\n') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&#10;", 5);
            cur++;
            base = cur;
        } else if (*cur == '\r') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&#13;", 5);
            cur++;
            base = cur;
        } else if (*cur == '\t') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&#9;", 4);
            cur++;
            base = cur;
        } else if (*cur == '"') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&quot;", 6);
            cur++;
            base = cur;
        } else if (*cur == '<') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&lt;", 4);
            cur++;
            base = cur;
        } else if (*cur == '>') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&gt;", 4);
            cur++;
            base = cur;
        } else if (*cur == '&') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&amp;", 5);
            cur++;
            base = cur;
        } else if ((*cur >= 0x80) && (cur[1] != 0) &&
	           ((doc == NULL) || (doc->encoding == NULL))) {
            /*
             * We assume we have UTF-8 content.
             */
            unsigned char tmp[12];
            int val = 0, l = 1;

            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            if (*cur < 0xC0) {
                xmlSaveErr(XML_SAVE_NOT_UTF8, (xmlNodePtr) attr, NULL);
		xmlSerializeHexCharRef(tmp, *cur);
                xmlBufAdd(buf, (xmlChar *) tmp, -1);
                cur++;
                base = cur;
                continue;
            } else if (*cur < 0xE0) {
                val = (cur[0]) & 0x1F;
                val <<= 6;
                val |= (cur[1]) & 0x3F;
                l = 2;
            } else if ((*cur < 0xF0) && (cur [2] != 0)) {
                val = (cur[0]) & 0x0F;
                val <<= 6;
                val |= (cur[1]) & 0x3F;
                val <<= 6;
                val |= (cur[2]) & 0x3F;
                l = 3;
            } else if ((*cur < 0xF8) && (cur [2] != 0) && (cur[3] != 0)) {
                val = (cur[0]) & 0x07;
                val <<= 6;
                val |= (cur[1]) & 0x3F;
                val <<= 6;
                val |= (cur[2]) & 0x3F;
                val <<= 6;
                val |= (cur[3]) & 0x3F;
                l = 4;
            }
            if ((l == 1) || (!IS_CHAR(val))) {
                xmlSaveErr(XML_SAVE_CHAR_INVALID, (xmlNodePtr) attr, NULL);
		xmlSerializeHexCharRef(tmp, *cur);
                xmlBufAdd(buf, (xmlChar *) tmp, -1);
                cur++;
                base = cur;
                continue;
            }
            /*
             * We could do multiple things here. Just save
             * as a char ref
             */
	    xmlSerializeHexCharRef(tmp, val);
            xmlBufAdd(buf, (xmlChar *) tmp, -1);
            cur += l;
            base = cur;
        } else {
            cur++;
        }
    }
    if (base != cur)
        xmlBufAdd(buf, base, cur - base);
}